

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionController::InsertUnlockingScript
          (ConfidentialTransactionController *this,Txid *txid,uint32_t vout,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_scripts)

{
  bool bVar1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *in_RCX;
  uint32_t in_EDX;
  Txid *in_RSI;
  long in_RDI;
  ConfidentialTransaction *pCVar2;
  ByteData *data;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range2_1;
  ScriptElement *element;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *__range2;
  ScriptBuilder builder;
  Script script;
  uint32_t txin_index;
  AbstractTxInReference *in_stack_fffffffffffffd58;
  uint32_t in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 uVar3;
  Script local_280;
  reference local_248;
  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_240;
  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_238;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_230;
  reference local_228;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_220;
  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
  local_218;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_210;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *local_1f8;
  ScriptBuilder local_1f0;
  ConfidentialTxInReference local_1c0;
  Script local_60;
  uint32_t local_24;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_20;
  
  pCVar2 = (ConfidentialTransaction *)(in_RDI + 0x10);
  local_20 = in_RCX;
  local_24 = core::ConfidentialTransaction::GetTxInIndex(pCVar2,in_RSI,in_EDX);
  core::ConfidentialTransaction::GetTxIn(&local_1c0,pCVar2,local_24);
  core::AbstractTxInReference::GetUnlockingScript(in_stack_fffffffffffffd58);
  core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)
             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  bVar1 = core::Script::IsEmpty(&local_60);
  uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffd64);
  if (bVar1) {
    core::ConfidentialTransaction::SetUnlockingScript
              ((ConfidentialTransaction *)(in_RDI + 0x10),local_24,local_20);
  }
  else {
    core::ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x557e53);
    core::Script::GetElementList(&local_210,&local_60);
    local_1f8 = &local_210;
    local_218._M_current =
         (ScriptElement *)
         std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::begin
                   (local_1f8);
    local_220._M_current =
         (ScriptElement *)
         std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::end
                   (local_1f8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_218,&local_220);
      if (!bVar1) break;
      local_228 = __gnu_cxx::
                  __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
                  ::operator*(&local_218);
      core::ScriptBuilder::AppendElement(&local_1f0,local_228);
      __gnu_cxx::
      __normal_iterator<cfd::core::ScriptElement_*,_std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>_>
      ::operator++(&local_218);
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)pCVar2
              );
    local_230 = local_20;
    local_238._M_current =
         (ByteData *)
         std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin(local_20);
    local_240._M_current =
         (ByteData *)
         std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end(local_230);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_238,&local_240);
      if (!bVar1) break;
      local_248 = __gnu_cxx::
                  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                  ::operator*(&local_238);
      core::ScriptBuilder::AppendData(&local_1f0,local_248);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
      ::operator++(&local_238);
    }
    pCVar2 = (ConfidentialTransaction *)(in_RDI + 0x10);
    in_stack_fffffffffffffd60 = local_24;
    core::ScriptBuilder::Build(&local_280,&local_1f0);
    core::ConfidentialTransaction::SetUnlockingScript(pCVar2,in_stack_fffffffffffffd60,&local_280);
    core::Script::~Script((Script *)CONCAT44(uVar3,in_stack_fffffffffffffd60));
    core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x558012);
  }
  core::Script::~Script((Script *)CONCAT44(uVar3,in_stack_fffffffffffffd60));
  return;
}

Assistant:

void ConfidentialTransactionController::InsertUnlockingScript(
    const Txid& txid, uint32_t vout,
    const std::vector<ByteData>& unlocking_scripts) {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  Script script = transaction_.GetTxIn(txin_index).GetUnlockingScript();
  if (script.IsEmpty()) {
    transaction_.SetUnlockingScript(txin_index, unlocking_scripts);
  } else {
    ScriptBuilder builder;
    for (const auto& element : script.GetElementList()) {
      builder.AppendElement(element);
    }
    for (const ByteData& data : unlocking_scripts) {
      builder.AppendData(data);
    }
    transaction_.SetUnlockingScript(txin_index, builder.Build());
  }
}